

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
* makePalsAsSpecified(tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                      *__return_storage_ptr__,
                     vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  ProtoPalette *this;
  pointer pPVar1;
  pointer paVar2;
  FILE *__stream;
  _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
  *p_Var3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  const_iterator pvVar7;
  const_iterator pvVar8;
  undefined4 extraout_var;
  const_iterator pvVar9;
  char *pcVar10;
  Palette *pal;
  Rgba *this_00;
  long lVar11;
  pointer pPVar12;
  size_t i;
  ulong uVar13;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> _Var14;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> __it;
  long lVar15;
  undefined1 *puVar16;
  Rgba *pRVar17;
  vector<Palette,_std::allocator<Palette>_> palettes;
  DefaultInitVec<size_t> mappings;
  _Vector_base<Palette,_std::allocator<Palette>_> local_88;
  ulong local_70;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *local_68;
  Palette *local_60;
  ProtoPalette *local_58;
  _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
  *local_50;
  _Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  
  local_68 = protoPalettes;
  local_50 = (_Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
              *)__return_storage_ptr__;
  std::vector<Palette,_std::allocator<Palette>_>::vector
            ((vector<Palette,_std::allocator<Palette>_> *)&local_88,
             (long)options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_48);
  paVar2 = options.palSpec.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar12 = local_88._M_impl.super__Vector_impl_data._M_start;
  for (pRVar17 = (options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems; pRVar17 != paVar2->_M_elems;
      pRVar17 = pRVar17 + 4) {
    uVar13 = 0;
    for (this_00 = pRVar17; (uVar13 < options.nbColorsPerPal && (0xef < this_00->alpha));
        this_00 = this_00 + 1) {
      uVar5 = Rgba::cgbColor(this_00);
      (pPVar12->colors)._M_elems[uVar13] = uVar5;
      uVar13 = uVar13 + 1;
    }
    pPVar12 = pPVar12 + 1;
  }
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)&local_48,
           (long)(local_68->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(local_68->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_58);
  uVar13 = 0;
  local_70 = 0;
  do {
    p_Var3 = local_50;
    pPVar1 = (local_68->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_68->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) <= uVar13) {
      if ((local_70 & 1) != 0) {
        pcVar10 = "s were";
        if ((long)local_88._M_impl.super__Vector_impl_data._M_finish -
            (long)local_88._M_impl.super__Vector_impl_data._M_start == 8) {
          pcVar10 = " was";
        }
        fprintf(_stderr,"note: The following palette%s specified:\n",pcVar10);
        for (pPVar12 = local_88._M_impl.super__Vector_impl_data._M_start; __stream = _stderr,
            pPVar12 != local_88._M_impl.super__Vector_impl_data._M_finish; pPVar12 = pPVar12 + 1) {
          pvVar9 = Palette::begin(pPVar12);
          pvVar7 = Palette::end(pPVar12);
          puVar16 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
                    ::$_1::operator()<Palette>(Palette_const&)::buf;
          for (; pvVar9 != pvVar7; pvVar9 = pvVar9 + 1) {
            sprintf(puVar16,", $%04x",(ulong)*pvVar9);
            puVar16 = puVar16 + 7;
          }
          fprintf(__stream,"        [%s]\n",0x1215f2);
        }
        giveUp();
      }
      std::
      _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
      ::
      _Tuple_impl<std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>&,std::vector<Palette,std::allocator<Palette>>&,void>
                (local_50,(vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                           *)&local_48,(vector<Palette,_std::allocator<Palette>_> *)&local_88);
      std::
      _Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::~_Vector_base(&local_48);
      std::_Vector_base<Palette,_std::allocator<Palette>_>::~_Vector_base(&local_88);
      return (tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
              *)p_Var3;
    }
    this = pPVar1 + uVar13;
    local_60 = local_88._M_impl.super__Vector_impl_data._M_finish;
    lVar11 = (long)local_88._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88._M_impl.super__Vector_impl_data._M_start;
    __it._M_current = local_88._M_impl.super__Vector_impl_data._M_start;
    local_58 = this;
    for (lVar15 = lVar11 >> 5; _Var14._M_current = __it._M_current, 0 < lVar15; lVar15 = lVar15 + -1
        ) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
              ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                            *)&local_58,__it);
      if (bVar4) goto LAB_0010d3f5;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
              ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                            *)&local_58,__it._M_current + 1);
      _Var14._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_0010d3f5;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
              ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                            *)&local_58,__it._M_current + 2);
      _Var14._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_0010d3f5;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
              ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                            *)&local_58,__it._M_current + 3);
      _Var14._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_0010d3f5;
      __it._M_current = __it._M_current + 4;
      lVar11 = lVar11 + -0x20;
    }
    lVar11 = lVar11 >> 3;
    if (lVar11 == 1) {
LAB_0010d488:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
              ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                            *)&local_58,__it);
      _Var14._M_current = local_60;
      if (bVar4) {
        _Var14._M_current = __it._M_current;
      }
    }
    else if (lVar11 == 2) {
LAB_0010d3c9:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
              ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                            *)&local_58,_Var14);
      if (!bVar4) {
        __it._M_current = _Var14._M_current + 1;
        goto LAB_0010d488;
      }
    }
    else {
      _Var14._M_current = local_60;
      if ((lVar11 == 3) &&
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_58,__it), _Var14._M_current = __it._M_current, !bVar4)) {
        _Var14._M_current = __it._M_current + 1;
        goto LAB_0010d3c9;
      }
    }
LAB_0010d3f5:
    if (_Var14._M_current == local_88._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = ProtoPalette::empty(this);
      if (bVar4) {
        __assert_fail("!protoPal.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x260,"makePalsAsSpecified");
      }
      pvVar7 = ProtoPalette::begin(this);
      pvVar8 = ProtoPalette::end(this);
      puVar16 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::
                $_1::operator()<ProtoPalette>(ProtoPalette_const&)::buf;
      pvVar9 = pvVar8;
      for (; pvVar7 != pvVar8; pvVar7 = pvVar7 + 1) {
        iVar6 = sprintf(puVar16,", $%04x",(ulong)*pvVar7);
        pvVar9 = (const_iterator)CONCAT44(extraout_var,iVar6);
        puVar16 = puVar16 + 7;
      }
      local_70 = CONCAT71((int7)((ulong)pvVar9 >> 8),1);
      error("Could not fit tile colors [%s] in specified palettes",0x1215d2);
    }
    local_48._M_impl.super__Vector_impl_data._M_start[uVar13] =
         (long)_Var14._M_current - (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3;
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static std::tuple<DefaultInitVec<size_t>, std::vector<Palette>>
    makePalsAsSpecified(std::vector<ProtoPalette> const &protoPalettes) {
	// Convert the palette spec to actual palettes
	std::vector<Palette> palettes(options.palSpec.size());
	for (auto [spec, pal] : zip(options.palSpec, palettes)) {
		for (size_t i = 0; i < options.nbColorsPerPal && spec[i].isOpaque(); ++i) {
			pal[i] = spec[i].cgbColor();
		}
	}

	auto listColors = [](auto const &list) {
		static char buf[sizeof(", $XXXX, $XXXX, $XXXX, $XXXX")];
		char *ptr = buf;
		for (uint16_t cgbColor : list) {
			sprintf(ptr, ", $%04x", cgbColor);
			ptr += 7;
		}
		return &buf[2];
	};

	// Iterate through proto-palettes, and try mapping them to the specified palettes
	DefaultInitVec<size_t> mappings(protoPalettes.size());
	bool bad = false;
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		ProtoPalette const &protoPal = protoPalettes[i];
		// Find the palette...
		auto iter = std::find_if(palettes.begin(), palettes.end(), [&protoPal](Palette const &pal) {
			// ...which contains all colors in this proto-pal
			return std::all_of(protoPal.begin(), protoPal.end(), [&pal](uint16_t color) {
				return std::find(pal.begin(), pal.end(), color) != pal.end();
			});
		});

		if (iter == palettes.end()) {
			assert(!protoPal.empty());
			error("Could not fit tile colors [%s] in specified palettes", listColors(protoPal));
			bad = true;
		}
		mappings[i] = iter - palettes.begin(); // Bogus value, but whatever
	}
	if (bad) {
		fprintf(stderr, "note: The following palette%s specified:\n",
		        palettes.size() == 1 ? " was" : "s were");
		for (Palette const &pal : palettes) {
			fprintf(stderr, "        [%s]\n", listColors(pal));
		}
		giveUp();
	}

	return {mappings, palettes};
}